

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O1

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextToken(Lexer *this)

{
  uint __c;
  int iVar1;
  void *pvVar2;
  pointer *__ptr;
  Lexer *in_RSI;
  unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> result;
  undefined1 local_48 [16];
  Position local_38;
  
  while( true ) {
    __c = in_RSI->currentChar;
    if ((0x20 < (ulong)__c) || ((0x100000a00U >> ((ulong)__c & 0x3f) & 1) == 0)) break;
    nextChar(in_RSI);
  }
  in_RSI->currentStartIndex = in_RSI->currentEndIndex;
  iVar1 = isalpha(__c);
  if ((__c == 0x5f) || (iVar1 != 0)) {
    nextTokenId(this);
  }
  else {
    pvVar2 = memchr("\n\r",(int)(char)__c,3);
    if (pvVar2 == (void *)0x0) {
      pvVar2 = memchr(")]}",__c,4);
      if (pvVar2 == (void *)0x0) {
        if (__c == 0x27) {
          nextTokenChar(this);
        }
        else if (__c == 0x22) {
          nextTokenString(this);
        }
        else if (__c - 0x30 < 10) {
          nextTokenNum(this);
        }
        else {
          nextTokenOperator((Lexer *)local_48);
          if ((_func_int **)local_48._0_8_ == (_func_int **)0x0) {
            if (in_RSI->currentChar == -1) {
              nextTokenEOF(this);
            }
            else if (in_RSI->currentChar == 0x23) {
              nextTokenCapability(this);
            }
            else {
              getCurrentCursor(&local_38,in_RSI);
              local_48._8_8_ = operator_new(0x38);
              ((Error<pfederc::LexerErrorCode> *)local_48._8_8_)->logLevel = LVL_ERROR;
              ((Error<pfederc::LexerErrorCode> *)local_48._8_8_)->err =
                   LEX_ERR_GENERAL_INVALID_CHARACTER;
              (((Error<pfederc::LexerErrorCode> *)local_48._8_8_)->pos).line = local_38.line;
              (((Error<pfederc::LexerErrorCode> *)local_48._8_8_)->pos).startIndex =
                   local_38.startIndex;
              (((Error<pfederc::LexerErrorCode> *)local_48._8_8_)->pos).endIndex = local_38.endIndex
              ;
              (((Error<pfederc::LexerErrorCode> *)local_48._8_8_)->extraPos).
              super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (((Error<pfederc::LexerErrorCode> *)local_48._8_8_)->extraPos).
              super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              (((Error<pfederc::LexerErrorCode> *)local_48._8_8_)->extraPos).
              super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                                  *)in_RSI);
              if ((Error<pfederc::LexerErrorCode> *)local_48._8_8_ !=
                  (Error<pfederc::LexerErrorCode> *)0x0) {
                std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>::operator()
                          ((default_delete<pfederc::Error<pfederc::LexerErrorCode>_> *)
                           (local_48 + 8),(Error<pfederc::LexerErrorCode> *)local_48._8_8_);
              }
            }
          }
          else {
            this->_vptr_Lexer = (_func_int **)local_48._0_8_;
            local_48._0_8_ = (_func_int **)0x0;
          }
          if ((_func_int **)local_48._0_8_ != (_func_int **)0x0) {
            (**(code **)(*(_func_int **)local_48._0_8_ + 8))();
          }
        }
      }
      else {
        nextTokenBracket(this);
      }
    }
    else {
      nextTokenLine(this);
    }
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextToken() noexcept {
  // Ignore spaces
  skipSpace();
  // set token starting point
  currentStartIndex = currentEndIndex;

  if (std::isalpha(currentChar) || currentChar == '_')
    return nextTokenId();

  if (_isNewLineCharacter(currentChar))
    return nextTokenLine();

  if (std::strchr(")]}", currentChar))
    return nextTokenBracket();

  if (currentChar == '"')
    return nextTokenString();

  if (currentChar == '\'')
    return nextTokenChar();

  if (std::isdigit(currentChar))
    return nextTokenNum();

  std::unique_ptr<Token> result(nextTokenOperator());
  if (result)
    return result;

  if (currentChar == '#')
    return nextTokenCapability();

  if (currentChar == std::char_traits<char>::eof())
    return nextTokenEOF();

  return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_GENERAL_INVALID_CHARACTER,
      getCurrentCursor()));
}